

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O2

void __thiscall
HawkTracer::client::TracepointMap::add_map_entry(TracepointMap *this,uint64_t id,string *label)

{
  mapped_type *this_00;
  Category category;
  MapInfo info;
  uint64_t local_50;
  MapInfo local_48;
  
  local_50 = id;
  std::__cxx11::string::string((string *)&local_48,(string *)label);
  category_to_string_abi_cxx11_(&local_48.category,(TracepointMap *)0x0,category);
  this_00 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this,&local_50);
  MapInfo::operator=(this_00,&local_48);
  MapInfo::~MapInfo(&local_48);
  return;
}

Assistant:

void TracepointMap::add_map_entry(uint64_t id, std::string label)
{
    MapInfo info = { label, category_to_string(Unknown) };
    _input_map[id] = info;
}